

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

void __thiscall
dg::vr::RelationsAnalyzer::solveDifferent
          (RelationsAnalyzer *this,ValueRelations *graph,BinaryOperator *op)

{
  BinaryOperator BVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  uint uVar5;
  Type TVar6;
  V rt;
  ulong uVar7;
  Relations RVar8;
  byte bVar9;
  V pVVar10;
  long lVar11;
  pointer ppVVar12;
  V param;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> pVar13;
  V val;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> sample;
  BinaryOperator *local_68;
  _Base_bitset<1UL> local_60;
  V local_58;
  long local_50;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> local_48;
  
  BVar1 = op[0x10];
  param = *(V *)(op + -0x40);
  if (param[0x10] == (Value)0x10) {
    if (BVar1 == (BinaryOperator)0x2a) {
      return;
    }
    pVVar10 = param;
    param = *(V *)(op + -0x20);
    if (*(V *)(op + -0x20) == (V)0x0) {
      return;
    }
  }
  else {
    pVVar10 = *(V *)(op + -0x20);
  }
  local_68 = op;
  local_58 = param;
  if (BVar1 == (BinaryOperator)0x2a) {
    bVar2 = llvm::APInt::isAllOnes((APInt *)(pVVar10 + 0x18));
    if (bVar2) goto LAB_0011e339;
    uVar5 = *(uint *)(pVVar10 + 0x20);
    if (uVar5 < 0x41) {
      if (*(long *)(pVVar10 + 0x18) != 1) {
        return;
      }
    }
    else {
      iVar3 = llvm::APInt::countLeadingZerosSlowCase();
      if (iVar3 != uVar5 - 1) {
        return;
      }
    }
LAB_0011e369:
    TVar6 = SGT;
    lVar11 = -1;
  }
  else {
    if (BVar1 != (BinaryOperator)0x28) {
      return;
    }
    uVar5 = *(uint *)(pVVar10 + 0x20);
    if (uVar5 < 0x41) {
      if (*(long *)(pVVar10 + 0x18) != 1) {
LAB_0011e346:
        bVar2 = llvm::APInt::isAllOnes((APInt *)(pVVar10 + 0x18));
        if (!bVar2) {
          return;
        }
        goto LAB_0011e369;
      }
    }
    else {
      iVar3 = llvm::APInt::countLeadingZerosSlowCase();
      if (iVar3 != uVar5 - 1) goto LAB_0011e346;
    }
LAB_0011e339:
    TVar6 = SLT;
    lVar11 = 1;
  }
  bVar2 = canShift(this,graph,param,TVar6);
  if (bVar2) {
    local_50 = lVar11;
    ValueRelations::set<llvm::Value_const*,llvm::BinaryOperator_const*>
              (graph,&local_58,TVar6,&local_68);
    local_60._M_w = 1L << (sbyte)TVar6;
    ValueRelations::getDirectlyRelated(&local_48,graph,local_58,(Relations *)&local_60);
    if (local_48.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ppVVar12 = local_48.
                 super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      do {
        local_60._M_w = (_WordT)*ppVVar12;
        TVar4 = dg::vr::Relations::getNonStrict(TVar6);
        ValueRelations::set<llvm::BinaryOperator_const*,llvm::Value_const*>
                  (graph,&local_68,TVar4,(Value **)&local_60);
        ppVVar12 = ppVVar12 + 1;
      } while (ppVVar12 !=
               local_48.
               super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    TVar4 = dg::vr::Relations::getNonStrict(TVar6);
    pVar13 = ValueRelations::getBound<llvm::Value_const*>(graph,&local_58,TVar4);
    rt = (V)pVar13.first;
    if ((rt != (V)0x0) &&
       (uVar7 = dg::vr::Relations::getNonStrict(TVar6),
       ((ulong)pVar13.second.bits.super__Base_bitset<1UL>._M_w.bits >> (uVar7 & 0x3f) & 1) != 0)) {
      uVar5 = dg::vr::Relations::getNonStrict(TVar6);
      RVar8 = ValueRelations::_between(graph,(V)local_68,rt);
      if (((ulong)RVar8.bits.super__Base_bitset<1UL>._M_w >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
        if (*(uint *)(rt + 0x20) < 0x41) {
          bVar9 = -(char)*(uint *)(rt + 0x20);
          lVar11 = (*(long *)(rt + 0x18) << (bVar9 & 0x3f)) >> (bVar9 & 0x3f);
        }
        else {
          lVar11 = **(long **)(rt + 0x18);
        }
        local_60._M_w = llvm::ConstantInt::get(*(IntegerType **)rt,lVar11 + local_50,true);
        TVar6 = dg::vr::Relations::getNonStrict(TVar6);
        ValueRelations::set<llvm::BinaryOperator_const*,llvm::ConstantInt_const*>
                  (graph,&local_68,TVar6,(ConstantInt **)&local_60);
      }
    }
    if (local_48.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void RelationsAnalyzer::solveDifferent(ValueRelations &graph,
                                       const llvm::BinaryOperator *op) {
    auto opcode = op->getOpcode();

    V param = nullptr;
    llvm::ConstantInt *c = nullptr;
    std::tie(param, c) = getParams(op);

    if (!param)
        return;

    assert(param && c);

    Relations::Type shift;
    if ((opcode == llvm::Instruction::Add && c->isOne()) ||
        (opcode == llvm::Instruction::Sub && c->isMinusOne())) {
        shift = Relations::SLT;
    } else if ((opcode == llvm::Instruction::Add && c->isMinusOne()) ||
               (opcode == llvm::Instruction::Sub && c->isOne())) {
        shift = Relations::SGT;
    } else
        return;

    if (canShift(graph, param, shift)) {
        graph.set(param, shift, op);

        std::vector<V> sample =
                graph.getDirectlyRelated(param, Relations().set(shift));

        for (V val : sample) {
            assert(graph.are(param, shift, val));
            graph.set(op, Relations::getNonStrict(shift), val);
        }

        auto boundC = graph.getBound(param, Relations::getNonStrict(shift));
        if (boundC.first && boundC.second.has(Relations::getNonStrict(shift)) &&
            !graph.are(op, Relations::getNonStrict(shift), boundC.first)) {
            int64_t intC = boundC.first->getSExtValue();
            intC += shift == Relations::SLT ? 1 : -1;
            const auto *newBound =
                    llvm::ConstantInt::get(boundC.first->getType(), intC, true);
            graph.set(op, Relations::getNonStrict(shift), newBound);
        }
    }
}